

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* httplib::make_basic_authentication_header
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *username,string *password,bool is_proxy)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 uStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,username,":");
  std::operator+(&local_60,&local_40,password);
  detail::base64_encode((string *)local_88,&local_60);
  std::operator+(&local_a8,"Basic ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  local_88 = (undefined1  [8])0x127e4b;
  if (is_proxy) {
    local_88 = (undefined1  [8])0x127e45;
  }
  local_80._M_p = local_78._M_local_buf + 8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    uStack_68 = local_a8.field_2._8_8_;
  }
  else {
    local_80._M_p = local_a8._M_dataplus._M_p;
  }
  local_78._M_allocated_capacity = local_a8._M_string_length;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,
             (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_88);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string, std::string>
	make_basic_authentication_header(const std::string &username,
									 const std::string &password,
									 bool is_proxy = false) {
		auto field = "Basic " + detail::base64_encode(username + ":" + password);
		auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
		return std::make_pair(key, std::move(field));
	}